

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::CreateBuffer::CreateBuffer
          (CreateBuffer *this,SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer,bool useSync,
          bool serverSync)

{
  Buffer *this_00;
  undefined1 local_60 [16];
  undefined1 local_50 [54];
  undefined1 local_1a;
  undefined1 local_19;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *pSStack_18;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer_local;
  CreateBuffer *this_local;
  
  local_1a = serverSync;
  local_19 = useSync;
  pSStack_18 = buffer;
  buffer_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)this;
  Operation::Operation(&this->super_Operation,"CreateBuffer",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CreateBuffer_03267728;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr(&this->m_buffer);
  this_00 = (Buffer *)operator_new(0x78);
  tcu::ThreadUtil::Operation::getEvent((Operation *)local_50);
  Operation::getSync((Operation *)local_60);
  GLES2ThreadTest::Buffer::Buffer
            (this_00,(SharedPtr<tcu::ThreadUtil::Event> *)local_50,
             (SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)local_60);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)(local_50 + 0x10),this_00);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator=
            (pSStack_18,(SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)(local_50 + 0x10));
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)(local_50 + 0x10));
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)local_60);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr((SharedPtr<tcu::ThreadUtil::Event> *)local_50);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator=(&this->m_buffer,pSStack_18);
  return;
}

Assistant:

CreateBuffer::CreateBuffer (SharedPtr<Buffer>& buffer, bool useSync, bool serverSync)
	: Operation	("CreateBuffer", useSync, serverSync)
{
	buffer = SharedPtr<Buffer>(new Buffer(getEvent(), getSync()));
	m_buffer = buffer;
}